

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  long in_RSI;
  long in_RDI;
  vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> columns;
  undefined4 in_stack_fffffffffffffa88;
  Code in_stack_fffffffffffffa8c;
  SummaryColumn *in_stack_fffffffffffffa90;
  allocator *paVar4;
  string *in_stack_fffffffffffffa98;
  SummaryColumn *in_stack_fffffffffffffaa0;
  SummaryColumn *this_00;
  allocator local_4c9;
  string local_4c8 [32];
  size_t in_stack_fffffffffffffb58;
  vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *in_stack_fffffffffffffb60;
  SummaryColumn *in_stack_fffffffffffffb68;
  ConsoleReporter *in_stack_fffffffffffffb70;
  undefined1 local_479 [232];
  allocator local_391;
  string local_390 [231];
  allocator local_2a9;
  string local_2a8 [231];
  allocator local_1c1;
  string local_1c0 [255];
  allocator local_c1;
  string local_c0 [79];
  allocator local_71;
  string local_70 [75];
  Colour local_25 [20];
  Colour local_11;
  long local_10;
  
  local_10 = in_RSI;
  sVar2 = Counts::total((Counts *)(in_RSI + 0x20));
  if (sVar2 == 0) {
    poVar3 = *(ostream **)(in_RDI + 0x18);
    Colour::Colour((Colour *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
    poVar3 = Catch::operator<<(poVar3,&local_11);
    std::operator<<(poVar3,"No tests ran\n");
    Colour::~Colour((Colour *)0x13e143);
  }
  else {
    sVar2 = Counts::total((Counts *)(local_10 + 8));
    if ((sVar2 == 0) || (bVar1 = Counts::allPassed((Counts *)(local_10 + 0x20)), !bVar1)) {
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::vector
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)0x13e4a7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"",&local_1c1);
      SummaryColumn::SummaryColumn
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                 (Code)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      Counts::total((Counts *)(local_10 + 0x20));
      SummaryColumn::addRow(in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      Counts::total((Counts *)(local_10 + 8));
      SummaryColumn::addRow(in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::push_back
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                 in_stack_fffffffffffffa90,
                 (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"passed",&local_2a9);
      SummaryColumn::SummaryColumn
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                 (Code)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      SummaryColumn::addRow(in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      SummaryColumn::addRow(in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::push_back
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                 in_stack_fffffffffffffa90,
                 (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,"failed",&local_391);
      SummaryColumn::SummaryColumn
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                 (Code)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      SummaryColumn::addRow(in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      SummaryColumn::addRow(in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::push_back
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                 in_stack_fffffffffffffa90,
                 (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      this_00 = (SummaryColumn *)local_479;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_479 + 1),"failed as expected",(allocator *)this_00);
      SummaryColumn::SummaryColumn
                (this_00,in_stack_fffffffffffffa98,(Code)((ulong)in_stack_fffffffffffffa90 >> 0x20))
      ;
      SummaryColumn::addRow(in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      SummaryColumn::addRow(in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::push_back
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                 in_stack_fffffffffffffa90,
                 (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      SummaryColumn::~SummaryColumn(in_stack_fffffffffffffa90);
      std::__cxx11::string::~string((string *)(local_479 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_479);
      paVar4 = (allocator *)&stack0xfffffffffffffb5f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffb60,"test cases",paVar4);
      printSummaryRow(in_stack_fffffffffffffb70,&in_stack_fffffffffffffb68->label,
                      in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffb60);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb5f);
      paVar4 = &local_4c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c8,"assertions",paVar4);
      printSummaryRow(in_stack_fffffffffffffb70,&in_stack_fffffffffffffb68->label,
                      in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      std::__cxx11::string::~string(local_4c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
      clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::~vector
                ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)this_00);
    }
    else {
      poVar3 = *(ostream **)(in_RDI + 0x18);
      Colour::Colour((Colour *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c);
      poVar3 = Catch::operator<<(poVar3,local_25);
      std::operator<<(poVar3,"All tests passed");
      Colour::~Colour((Colour *)0x13e204);
      std::operator<<(*(ostream **)(in_RDI + 0x18)," (");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"assertion",&local_71);
      pluralise::pluralise
                ((pluralise *)in_stack_fffffffffffffa90,
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),(string *)0x13e279);
      poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffa90,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      std::operator<<(poVar3," in ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"test case",&local_c1);
      pluralise::pluralise
                ((pluralise *)in_stack_fffffffffffffa90,
                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),(string *)0x13e304);
      poVar3 = Catch::operator<<((ostream *)in_stack_fffffffffffffa90,
                                 (pluralise *)
                                 CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88));
      poVar3 = std::operator<<(poVar3,')');
      std::operator<<(poVar3,'\n');
      pluralise::~pluralise((pluralise *)0x13e353);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      pluralise::~pluralise((pluralise *)0x13e37a);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
  }
  return;
}

Assistant:

void ConsoleReporter::printTotals( Totals const& totals ) {
    if (totals.testCases.total() == 0) {
        stream << Colour(Colour::Warning) << "No tests ran\n";
    } else if (totals.assertions.total() > 0 && totals.testCases.allPassed()) {
        stream << Colour(Colour::ResultSuccess) << "All tests passed";
        stream << " ("
            << pluralise(totals.assertions.passed, "assertion") << " in "
            << pluralise(totals.testCases.passed, "test case") << ')'
            << '\n';
    } else {

        std::vector<SummaryColumn> columns;
        columns.push_back(SummaryColumn("", Colour::None)
                          .addRow(totals.testCases.total())
                          .addRow(totals.assertions.total()));
        columns.push_back(SummaryColumn("passed", Colour::Success)
                          .addRow(totals.testCases.passed)
                          .addRow(totals.assertions.passed));
        columns.push_back(SummaryColumn("failed", Colour::ResultError)
                          .addRow(totals.testCases.failed)
                          .addRow(totals.assertions.failed));
        columns.push_back(SummaryColumn("failed as expected", Colour::ResultExpectedFailure)
                          .addRow(totals.testCases.failedButOk)
                          .addRow(totals.assertions.failedButOk));

        printSummaryRow("test cases", columns, 0);
        printSummaryRow("assertions", columns, 1);
    }
}